

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

SQInstance * __thiscall SQInstance::Clone(SQInstance *this,SQSharedState *ss)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQInstance *this_00;
  long local_40;
  SQInstance *newinst;
  SQInteger size;
  SQSharedState *ss_local;
  SQInstance *this_local;
  
  lVar1 = this->_class->_udsize;
  SVar2 = sqvector<SQClassMember>::size(&this->_class->_defaultvalues);
  if (SVar2 == 0) {
    local_40 = 0;
  }
  else {
    SVar2 = sqvector<SQClassMember>::size(&this->_class->_defaultvalues);
    local_40 = SVar2 - 1;
  }
  SVar2 = lVar1 + local_40 * 0x10 + 0x68;
  this_00 = (SQInstance *)sq_vm_malloc(SVar2);
  SQInstance(this_00,ss,this,SVar2);
  if (this->_class->_udsize != 0) {
    this_00->_userpointer = (SQUserPointer)((long)this_00 + (SVar2 - this->_class->_udsize));
  }
  return this_00;
}

Assistant:

SQInstance *Clone(SQSharedState *ss)
    {
        SQInteger size = calcinstancesize(_class);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, this,size);
        if(_class->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - _class->_udsize);
        }
        return newinst;
    }